

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Cube::setupLeftFace(Cube *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = this->x;
  fVar2 = this->y;
  fVar3 = this->z;
  fVar4 = this->h + fVar2;
  fVar5 = this->b + fVar3;
  this->positionData[0x24] = fVar1;
  this->positionData[0x25] = fVar2;
  this->positionData[0x26] = fVar3;
  this->positionData[0x27] = fVar1;
  this->positionData[0x28] = fVar4;
  this->positionData[0x29] = fVar3;
  this->positionData[0x2a] = fVar1;
  this->positionData[0x2b] = fVar4;
  this->positionData[0x2c] = fVar5;
  this->positionData[0x2d] = fVar1;
  this->positionData[0x2e] = fVar2;
  this->positionData[0x2f] = fVar3;
  this->positionData[0x30] = fVar1;
  this->positionData[0x31] = fVar4;
  this->positionData[0x32] = fVar5;
  this->positionData[0x33] = fVar1;
  this->positionData[0x34] = fVar2;
  this->positionData[0x35] = fVar5;
  return;
}

Assistant:

void setupLeftFace() {
        float leftFace[]={
            x,y,z,

            x,y+h,z,
            x,y+h,z+b,
            x,y,z,
            x,y+h,z+b,
            x,y,z+b
        };
        arrayCopy(leftFace,positionData,36);
    }